

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.h
# Opt level: O3

void google::protobuf::json_internal::ParseProto2Descriptor::SetFloat(Field f,Msg *msg,float x)

{
  byte bVar1;
  bool bVar2;
  ulong *puVar3;
  Metadata MVar4;
  
  RecordAsSeen(f,msg);
  bVar1 = f->field_0x1;
  bVar2 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 != bVar2) {
    puVar3 = (ulong *)(ulong)bVar2;
    SetFloat();
    if ((*puVar3 & 1) == 0) {
      absl::lts_20240722::status_internal::StatusRep::Unref();
    }
    return;
  }
  MVar4 = Message::GetMetadata(msg->msg_);
  if ((bVar1 & 0x20) != 0) {
    Reflection::AddFloat(MVar4.reflection,msg->msg_,f,x);
    return;
  }
  Reflection::SetFloat(MVar4.reflection,msg->msg_,f,x);
  return;
}

Assistant:

static void SetFloat(Field f, Msg& msg, float x) {
    RecordAsSeen(f, msg);
    if (f->is_repeated()) {
      msg.msg_->GetReflection()->AddFloat(msg.msg_, f, x);
    } else {
      msg.msg_->GetReflection()->SetFloat(msg.msg_, f, x);
    }
  }